

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

int nni_sock_find(nni_sock **sockp,uint32_t id)

{
  nni_sock *pnVar1;
  nni_sock *s;
  int rv;
  uint32_t id_local;
  nni_sock **sockp_local;
  
  s._0_4_ = 0;
  nni_mtx_lock(&sock_lk);
  pnVar1 = (nni_sock *)nni_id_get(&sock_ids,(ulong)id);
  if (pnVar1 == (nni_sock *)0x0) {
    s._0_4_ = 7;
  }
  else if ((pnVar1->s_closed & 1U) == 0) {
    pnVar1->s_ref = pnVar1->s_ref + 1;
    *sockp = pnVar1;
  }
  else {
    s._0_4_ = 7;
  }
  nni_mtx_unlock(&sock_lk);
  return (int)s;
}

Assistant:

int
nni_sock_find(nni_sock **sockp, uint32_t id)
{
	int       rv = 0;
	nni_sock *s;

	nni_mtx_lock(&sock_lk);
	if ((s = nni_id_get(&sock_ids, id)) != NULL) {
		if (s->s_closed) {
			rv = NNG_ECLOSED;
		} else {
			s->s_ref++;
			*sockp = s;
		}
	} else {
		rv = NNG_ECLOSED;
	}
	nni_mtx_unlock(&sock_lk);

	return (rv);
}